

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

void GetCurrentThreadStackLimits(ULONG_PTR *lowLimit,ULONG_PTR *highLimit)

{
  long lVar1;
  int iVar2;
  pthread_t __th;
  ULONG_PTR UVar3;
  long *in_FS_OFFSET;
  size_t local_80;
  size_t stacksize;
  void *stackend;
  pthread_attr_t attr;
  
  attr._48_8_ = in_FS_OFFSET[5];
  lVar1 = *in_FS_OFFSET;
  if (*(ULONG_PTR *)(lVar1 + -0x10) == 0) {
    __th = pthread_self();
    iVar2 = pthread_getattr_np(__th,(pthread_attr_t *)&stackend);
    if (iVar2 != 0) {
      fprintf(_stderr,"] %s %s:%d","GetCurrentThreadStackLimits",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x9c9);
      fprintf(_stderr,"Expression: status == 0, Description: pthread_getattr_np call failed");
    }
    iVar2 = pthread_attr_getstack((pthread_attr_t *)&stackend,(void **)&stacksize,&local_80);
    if (iVar2 != 0) {
      fprintf(_stderr,"] %s %s:%d","GetCurrentThreadStackLimits",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x9cf);
      fprintf(_stderr,"Expression: status == 0, Description: pthread_attr_getstack call failed");
    }
    UVar3 = stacksize + local_80;
    pthread_attr_destroy((pthread_attr_t *)&stackend);
    *lowLimit = stacksize;
    *highLimit = UVar3;
    *(ULONG_PTR *)(lVar1 + -0x10) = *lowLimit;
    *(ULONG_PTR *)(lVar1 + -8) = UVar3;
  }
  else {
    *lowLimit = *(ULONG_PTR *)(lVar1 + -0x10);
    *highLimit = *(ULONG_PTR *)(lVar1 + -8);
  }
  if (in_FS_OFFSET[5] == attr._48_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetCurrentThreadStackLimits(ULONG_PTR* lowLimit, ULONG_PTR* highLimit)
{
#ifndef __IOS__
    if (s_cachedLowLimit)
    {
        *lowLimit = s_cachedLowLimit;
        *highLimit = s_cachedHighLimit;
        return;
    }
#endif
    pthread_t currentThreadHandle = pthread_self();

#ifdef __APPLE__
    GetInternalStackLimit(currentThreadHandle, highLimit, lowLimit);
#else
    pthread_attr_t attr;
    size_t stacksize;
    void* stackend;
    int status;

#if HAVE_PTHREAD_ATTR_GET_NP
    status = pthread_attr_get_np(currentThreadHandle, &attr);
    _ASSERT_MSG(status != 0, "pthread_attr_get_np call failed");
#elif HAVE_PTHREAD_GETATTR_NP
    status = pthread_getattr_np(currentThreadHandle, &attr);
    _ASSERT_MSG(status == 0, "pthread_getattr_np call failed");
#else
#   error "Don't know how to get thread attributes on this platform!"
#endif

    status = pthread_attr_getstack(&attr, &stackend, &stacksize);
    _ASSERT_MSG(status == 0, "pthread_attr_getstack call failed");

    void* stackbase = (void*) ((char*) stackend + stacksize);

    pthread_attr_destroy(&attr);

    *lowLimit = (ULONG_PTR) stackend;
    *highLimit = (ULONG_PTR) stackbase;
#endif

#ifndef __IOS__
    s_cachedLowLimit = *lowLimit;
    s_cachedHighLimit = *highLimit;
#endif
}